

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int impliesNotNullRow(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  uint uVar2;
  Table *pTVar3;
  Expr *pE2;
  int iVar4;
  Expr *pE1;
  
  uVar2 = pExpr->flags;
  iVar4 = 1;
  if ((uVar2 & 1) != 0) {
    return 1;
  }
  if (((uVar2 & 2) != 0) && (pWalker->mWFlags != 0)) {
    return 1;
  }
  uVar1 = pExpr->op;
  switch(uVar1) {
  case '+':
  case ',':
    pE1 = pExpr->pLeft;
    pE2 = pExpr->pRight;
    goto LAB_0017ca5e;
  case '-':
  case '.':
  case '3':
  case '4':
    goto switchD_0017c9be_caseD_2d;
  case '/':
  case '0':
    break;
  case '1':
    if (pExpr->pLeft != (Expr *)0x0) {
      sqlite3WalkExprNN(pWalker,pExpr->pLeft);
    }
    pE1 = ((pExpr->x).pList)->a[0].pExpr;
    pE2 = *(Expr **)((pExpr->x).pList + 1);
LAB_0017ca5e:
    bothImplyNotNullRow(pWalker,pE1,pE2);
    return 1;
  case '2':
    if ((uVar2 >> 0xc & 1) != 0) {
      return 1;
    }
    if (((pExpr->x).pList)->nExpr < 1) {
      return 1;
    }
    if (pExpr->pLeft == (Expr *)0x0) {
      return 1;
    }
    sqlite3WalkExprNN(pWalker,pExpr->pLeft);
    return 1;
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case ':':
    if (((pExpr->pLeft->op == 0xa8) && (pTVar3 = (pExpr->pLeft->y).pTab, pTVar3 != (Table *)0x0)) &&
       (pTVar3->eTabType == '\x01')) {
      return 1;
    }
    if (((pExpr->pRight->op == 0xa8) && (pTVar3 = (pExpr->pRight->y).pTab, pTVar3 != (Table *)0x0))
       && (pTVar3->eTabType == '\x01')) {
      return 1;
    }
    break;
  default:
    switch(uVar1) {
    case 0xa8:
      if ((pWalker->u).n != pExpr->iTable) {
        return 1;
      }
      pWalker->eCode = 1;
      return 2;
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xad:
    case 0xae:
    case 0xb0:
      break;
    case 0xac:
    case 0xaf:
    case 0xb1:
      goto switchD_0017c9be_caseD_2d;
    default:
      if (uVar1 == 0x9e) {
        return 1;
      }
    }
  }
  iVar4 = 0;
switchD_0017c9be_caseD_2d:
  return iVar4;
}

Assistant:

static int impliesNotNullRow(Walker *pWalker, Expr *pExpr){
  testcase( pExpr->op==TK_AGG_COLUMN );
  testcase( pExpr->op==TK_AGG_FUNCTION );
  if( ExprHasProperty(pExpr, EP_OuterON) ) return WRC_Prune;
  if( ExprHasProperty(pExpr, EP_InnerON) && pWalker->mWFlags ){
    /* If iCur is used in an inner-join ON clause to the left of a
    ** RIGHT JOIN, that does *not* mean that the table must be non-null.
    ** But it is difficult to check for that condition precisely.
    ** To keep things simple, any use of iCur from any inner-join is
    ** ignored while attempting to simplify a RIGHT JOIN. */
    return WRC_Prune;
  }
  switch( pExpr->op ){
    case TK_ISNOT:
    case TK_ISNULL:
    case TK_NOTNULL:
    case TK_IS:
    case TK_VECTOR:
    case TK_FUNCTION:
    case TK_TRUTH:
    case TK_CASE:
      testcase( pExpr->op==TK_ISNOT );
      testcase( pExpr->op==TK_ISNULL );
      testcase( pExpr->op==TK_NOTNULL );
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_VECTOR );
      testcase( pExpr->op==TK_FUNCTION );
      testcase( pExpr->op==TK_TRUTH );
      testcase( pExpr->op==TK_CASE );
      return WRC_Prune;

    case TK_COLUMN:
      if( pWalker->u.iCur==pExpr->iTable ){
        pWalker->eCode = 1;
        return WRC_Abort;
      }
      return WRC_Prune;

    case TK_OR:
    case TK_AND:
      /* Both sides of an AND or OR must separately imply non-null-row.
      ** Consider these cases:
      **    1.  NOT (x AND y)
      **    2.  x OR y
      ** If only one of x or y is non-null-row, then the overall expression
      ** can be true if the other arm is false (case 1) or true (case 2).
      */
      testcase( pExpr->op==TK_OR );
      testcase( pExpr->op==TK_AND );
      bothImplyNotNullRow(pWalker, pExpr->pLeft, pExpr->pRight);
      return WRC_Prune;

    case TK_IN:
      /* Beware of "x NOT IN ()" and "x NOT IN (SELECT 1 WHERE false)",
      ** both of which can be true.  But apart from these cases, if
      ** the left-hand side of the IN is NULL then the IN itself will be
      ** NULL. */
      if( ExprUseXList(pExpr) && ALWAYS(pExpr->x.pList->nExpr>0) ){
        sqlite3WalkExpr(pWalker, pExpr->pLeft);
      }
      return WRC_Prune;

    case TK_BETWEEN:
      /* In "x NOT BETWEEN y AND z" either x must be non-null-row or else
      ** both y and z must be non-null row */
      assert( ExprUseXList(pExpr) );
      assert( pExpr->x.pList->nExpr==2 );
      sqlite3WalkExpr(pWalker, pExpr->pLeft);
      bothImplyNotNullRow(pWalker, pExpr->x.pList->a[0].pExpr,
                                   pExpr->x.pList->a[1].pExpr);
      return WRC_Prune;

    /* Virtual tables are allowed to use constraints like x=NULL.  So
    ** a term of the form x=y does not prove that y is not null if x
    ** is the column of a virtual table */
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      Expr *pLeft = pExpr->pLeft;
      Expr *pRight = pExpr->pRight;
      testcase( pExpr->op==TK_EQ );
      testcase( pExpr->op==TK_NE );
      testcase( pExpr->op==TK_LT );
      testcase( pExpr->op==TK_LE );
      testcase( pExpr->op==TK_GT );
      testcase( pExpr->op==TK_GE );
      /* The y.pTab=0 assignment in wherecode.c always happens after the
      ** impliesNotNullRow() test */
      assert( pLeft->op!=TK_COLUMN || ExprUseYTab(pLeft) );
      assert( pRight->op!=TK_COLUMN || ExprUseYTab(pRight) );
      if( (pLeft->op==TK_COLUMN
           && ALWAYS(pLeft->y.pTab!=0)
           && IsVirtual(pLeft->y.pTab))
       || (pRight->op==TK_COLUMN
           && ALWAYS(pRight->y.pTab!=0)
           && IsVirtual(pRight->y.pTab))
      ){
        return WRC_Prune;
      }
      /* no break */ deliberate_fall_through
    }
    default:
      return WRC_Continue;
  }
}